

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3286:20)>
::setValue(BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3286:20)>
           *this,string *arg)

{
  ParserResult *in_RDI;
  string *in_stack_00000030;
  anon_class_8_1_50637480_for_m_lambda *in_stack_00000038;
  
  invokeLambda<bool,Catch::makeCommandLineParser(Catch::ConfigData&)::__4>
            (in_stack_00000038,in_stack_00000030);
  return in_RDI;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }